

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::WindowDataParameter::InternalSwap(WindowDataParameter *this,WindowDataParameter *other)

{
  InternalMetadataWithArena *this_00;
  WindowDataParameter *other_local;
  WindowDataParameter *this_local;
  Container *local_30;
  
  std::swap<std::__cxx11::string*>(&(this->source_).ptr_,&(other->source_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->mean_file_).ptr_,&(other->mean_file_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->crop_mode_).ptr_,&(other->crop_mode_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->root_folder_).ptr_,&(other->root_folder_).ptr_);
  std::swap<unsigned_int>(&this->batch_size_,&other->batch_size_);
  std::swap<unsigned_int>(&this->crop_size_,&other->crop_size_);
  std::swap<bool>(&this->mirror_,&other->mirror_);
  std::swap<bool>(&this->cache_images_,&other->cache_images_);
  std::swap<unsigned_int>(&this->context_pad_,&other->context_pad_);
  std::swap<float>(&this->scale_,&other->scale_);
  std::swap<float>(&this->fg_threshold_,&other->fg_threshold_);
  std::swap<float>(&this->bg_threshold_,&other->bg_threshold_);
  std::swap<float>(&this->fg_fraction_,&other->fg_fraction_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_007ac442;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap
            (&this->_internal_metadata_,&local_30->unknown_fields);
LAB_007ac442:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void WindowDataParameter::InternalSwap(WindowDataParameter* other) {
  source_.Swap(&other->source_);
  mean_file_.Swap(&other->mean_file_);
  crop_mode_.Swap(&other->crop_mode_);
  root_folder_.Swap(&other->root_folder_);
  std::swap(batch_size_, other->batch_size_);
  std::swap(crop_size_, other->crop_size_);
  std::swap(mirror_, other->mirror_);
  std::swap(cache_images_, other->cache_images_);
  std::swap(context_pad_, other->context_pad_);
  std::swap(scale_, other->scale_);
  std::swap(fg_threshold_, other->fg_threshold_);
  std::swap(bg_threshold_, other->bg_threshold_);
  std::swap(fg_fraction_, other->fg_fraction_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}